

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall logging::log(logging *this,double __x)

{
  char in_AL;
  bool bVar1;
  char *in_RDX;
  loglevel in_ESI;
  double extraout_XMM0_Qa;
  double dVar2;
  va_list ap;
  char text [1024];
  ostream *os;
  ostream *local_508;
  undefined1 local_4f8 [48];
  double local_4c8;
  undefined4 local_448;
  undefined4 local_444;
  undefined1 *local_440;
  undefined1 *local_438;
  char local_428 [1032];
  ostream *local_20;
  char *local_18;
  loglevel local_c;
  logging *local_8;
  
  if (in_AL != '\0') {
    local_4c8 = __x;
  }
  if (in_ESI == ERROR) {
    this->cntErrors = this->cntErrors + 1;
  }
  if (in_ESI == WARNING) {
    this->cntWarnings = this->cntWarnings + 1;
  }
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = this;
  bVar1 = doPrint(this,in_ESI);
  dVar2 = extraout_XMM0_Qa;
  if (bVar1) {
    if ((int)local_c < 1) {
      local_508 = (ostream *)&std::cout;
    }
    else {
      local_508 = (ostream *)&std::cerr;
    }
    local_20 = local_508;
    memset(local_428,0,0x3ff);
    local_438 = local_4f8;
    local_440 = &stack0x00000008;
    local_444 = 0x30;
    local_448 = 0x18;
    vsnprintf(local_428,0x3ff,local_18,&local_448);
    if ((this->lastrelog & 1U) != 0) {
      this->lastrelog = false;
      std::ostream::operator<<(local_20,std::endl<char,std::char_traits<char>>);
    }
    if ((this->useColor & 1U) != 0) {
      switch(local_c) {
      case DEBUG:
        std::operator<<(local_20,"\x1b[1;30m");
        break;
      default:
        break;
      case GOODNEWS:
        std::operator<<(local_20,"\x1b[1;32m");
        break;
      case WARNING:
        std::operator<<(local_20,"\x1b[1;33m");
        break;
      case ERROR:
        std::operator<<(local_20,"\x1b[1;31m");
      }
    }
    if (local_c == WARNING) {
      std::operator<<(local_20,"WARNING: ");
    }
    else if (local_c == ERROR) {
      std::operator<<(local_20,"ERROR: ");
    }
    std::operator<<(local_20,local_428);
    if (((this->useColor & 1U) != 0) &&
       ((((local_c == ERROR || (local_c == WARNING)) || (local_c == GOODNEWS)) || (local_c == DEBUG)
        ))) {
      std::operator<<(local_20,"\x1b[0;m");
    }
    dVar2 = (double)std::ostream::flush();
  }
  return dVar2;
}

Assistant:

void logging::log(loglevel level, const char* fmt, ... ) {

	// Save some statistics
	if(level == ERROR)
		cntErrors++;
	if(level == WARNING)
		cntWarnings++;


	// Check if level suffices...
	if( ! doPrint(level) )
		return;

	// Default output of log message
	std::ostream & os  = level >= INFO ? std::cerr : std::cout;

	char text[1024];
	memset(text, 0, sizeof(char)*1023);

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(text, 1023, fmt, ap);
	va_end(ap);


	// Make a new line if last cmd was a relog command
	if(lastrelog)
	{
		lastrelog=false;
		os << std::endl;
	}

	// Switch color
	if( useColor )
	{
		switch( level )
		{
			case ERROR:
				os << "\033[1;31m";
				break;
			case WARNING:
				os << "\033[1;33m";
				break;
			case GOODNEWS:
				os << "\033[1;32m";
				break;
			case DEBUG:
				os << "\033[1;30m";
				break;
			default:
				break;
		}
	}


	switch( level )
	{
		case ERROR:
			os << "ERROR: ";
			break;
		case WARNING:
			os << "WARNING: ";
			break;
		default:
			break;
	}

	os << text;

	if( useColor ) {
		if( level==ERROR || level==WARNING || level==GOODNEWS || level==DEBUG )	
		os << "\033[0;m";
	}

	os.flush();
}